

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<kj::Repeat<char>,char_const*&,char_const(&)[2],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String,char>
          (String *__return_storage_ptr__,kj *this,Repeat<char> *params,char **params_1,
          char (*params_2) [2],int *params_3,char (*params_4) [3],LogSeverity *params_5,
          char (*params_6) [3],String *params_7,char *params_8)

{
  char *pcVar1;
  FixedArray<char,_1UL> *in_stack_ffffffffffffff38;
  undefined1 local_b9;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  kj local_68 [8];
  undefined8 local_60;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_68[0] = *this;
  local_60 = *(undefined8 *)(this + 8);
  local_78 = toCharSequence<char_const*&>((char **)params);
  local_88 = toCharSequence<char_const(&)[2]>((char (*) [2])params_1);
  toCharSequence<int&>(&local_48,(kj *)params_2,(int *)local_88.size_);
  local_98 = toCharSequence<char_const(&)[3]>((char (*) [3])params_3);
  local_a8 = (ArrayPtr<const_char>)toCharSequence<kj::LogSeverity&>((LogSeverity *)params_4);
  local_b8 = toCharSequence<char_const(&)[3]>((char (*) [3])params_5);
  pcVar1 = *(char **)(params_6[2] + 2);
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = *(char **)params_6;
  }
  local_58.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_58.size_ = (size_t)(pcVar1 + -1);
  }
  local_b9 = *(undefined1 *)&(params_7->content).ptr;
  _::
  concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)local_68,(Repeat<char> *)&local_78,&local_88,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_98,&local_a8,
             (StringPtr *)&local_b8,&local_58,(ArrayPtr<const_char> *)&local_b9,
             in_stack_ffffffffffffff38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}